

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writesrc.cpp
# Opt level: O2

void usrc_writeArrayOfMostlyInvChars(FILE *f,char *prefix,char *p,int32_t length,char *postfix)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  char *__format;
  int iVar5;
  uint uVar6;
  
  if (prefix != (char *)0x0) {
    fprintf((FILE *)f,prefix,(long)length);
  }
  if (length < 1) {
    length = 0;
  }
  iVar5 = 0;
  uVar2 = 0xffffffff;
  uVar3 = 0xffffffff;
  for (uVar4 = 0; uVar6 = uVar2, (uint)length != uVar4; uVar4 = uVar4 + 1) {
    bVar1 = p[uVar4];
    if (uVar4 != 0) {
      if (((iVar5 < 0x20) && (((int)uVar3 < 0x20 || iVar5 < 0x18) || uVar6 != 0)) &&
         ((iVar5 < 0x10 || (0x1e < (byte)(bVar1 - 1) || (int)uVar6 < 0x20 && uVar6 != 0)))) {
        fputc(0x2c,(FILE *)f);
      }
      else {
        fputs(",\n",(FILE *)f);
        iVar5 = 0;
      }
    }
    __format = "\'%c\'";
    if (bVar1 < 0x20) {
      __format = "%u";
    }
    fprintf((FILE *)f,__format,(ulong)bVar1);
    iVar5 = iVar5 + 1;
    uVar2 = (uint)bVar1;
    uVar3 = uVar6;
  }
  if (postfix != (char *)0x0) {
    fputs(postfix,(FILE *)f);
    return;
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
usrc_writeArrayOfMostlyInvChars(FILE *f,
                                const char *prefix,
                                const char *p, int32_t length,
                                const char *postfix) {
    int32_t i, col;
    int prev2, prev, c;

    if(prefix!=NULL) {
        fprintf(f, prefix, (long)length);
    }
    prev2=prev=-1;
    for(i=col=0; i<length; ++i, ++col) {
        c=(uint8_t)p[i];
        if(i>0) {
            /* Break long lines. Try to break at interesting places, to minimize revision diffs. */
            if( 
                /* Very long line. */
                col>=32 ||
                /* Long line, break after terminating NUL. */
                (col>=24 && prev2>=0x20 && prev==0) ||
                /* Medium-long line, break before non-NUL, non-character byte. */
                (col>=16 && (prev==0 || prev>=0x20) && 0<c && c<0x20)
            ) {
                fputs(",\n", f);
                col=0;
            } else {
                fputc(',', f);
            }
        }
        fprintf(f, c<0x20 ? "%u" : "'%c'", c);
        prev2=prev;
        prev=c;
    }
    if(postfix!=NULL) {
        fputs(postfix, f);
    }
}